

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[37],char_const*,char[38],unsigned_int,char[5],unsigned_int,char[31],unsigned_int>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [37],char **Args_1,
          char (*Args_2) [38],uint *Args_3,char (*Args_4) [5],uint *Args_5,char (*Args_6) [31],
          uint *Args_7)

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[37],char_const*,char[38],unsigned_int,char[5],unsigned_int,char[31],unsigned_int>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [37])this,(char **)Args,(char (*) [38])Args_1,(uint *)Args_2,
             (char (*) [5])Args_3,(uint *)Args_4,(char (*) [31])Args_5,(uint *)Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}